

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

byte * __thiscall nuraft::buffer::get_bytes(buffer *this,size_t *len)

{
  uint uVar1;
  overflow_error *this_00;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  buffer *pbVar6;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar5 = uVar1 & 0x7fffffff;
  }
  else {
    uVar5 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar3 = *(uint *)(this + 4);
  }
  else {
    uVar3 = (uint)*(ushort *)(this + 2);
  }
  if ((ulong)uVar5 - (ulong)uVar3 < 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error
              (this_00,"insufficient buffer available for a bytes length (int32)");
  }
  else {
    if ((int)uVar1 < 0) {
      lVar2 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar2 = (ulong)*(ushort *)(this + 2) + 4;
    }
    pbVar6 = this + lVar2;
    lVar2 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + ((uint)(byte)*pbVar6 << ((byte)lVar2 & 0x1f));
      lVar2 = lVar2 + 8;
      pbVar6 = pbVar6 + 1;
    } while (lVar2 != 0x20);
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 4;
    }
    else {
      *(short *)(this + 2) = *(short *)(this + 2) + 4;
    }
    *len = (long)iVar4;
    uVar1 = *(uint *)this;
    if ((int)uVar1 < 0) {
      lVar2 = (ulong)*(uint *)(this + 4) + 8;
      uVar5 = uVar1 & 0x7fffffff;
    }
    else {
      lVar2 = (ulong)*(ushort *)(this + 2) + 4;
      uVar5 = (uint)*(ushort *)this;
    }
    if ((int)uVar1 < 0) {
      uVar3 = *(uint *)(this + 4);
    }
    else {
      uVar3 = (uint)*(ushort *)(this + 2);
    }
    if ((ulong)(long)iVar4 <= (ulong)uVar5 - (ulong)uVar3) {
      if ((int)uVar1 < 0) {
        *(int *)(this + 4) = *(int *)(this + 4) + iVar4;
      }
      else {
        *(short *)(this + 2) = *(short *)(this + 2) + (short)iVar4;
      }
      return (byte *)(this + lVar2);
    }
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte array");
  }
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}